

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# malloc.hpp
# Opt level: O0

void BCL::local_free<char>(GlobalPtr<char> *ptr)

{
  long lVar1;
  long lVar2;
  long *plVar3;
  char *pcVar4;
  size_t sVar5;
  long *plVar6;
  runtime_error *this;
  long *local_28;
  chunk_t *neighbor_chunk;
  chunk_t *my_chunk;
  char *vptr;
  GlobalPtr<char> *ptr_local;
  
  if ((bcl_finalized & 1) == 0) {
    std::mutex::lock((mutex *)malloc_mutex);
    pcVar4 = GlobalPtr<char>::local(ptr);
    if (pcVar4 == (char *)0x0) {
      std::mutex::unlock((mutex *)malloc_mutex);
    }
    else {
      sVar5 = chunk_t_size();
      plVar6 = (long *)(pcVar4 + -sVar5);
      for (local_28 = flist; (local_28 != (long *)0x0 && (plVar6 <= local_28));
          local_28 = (long *)local_28[2]) {
      }
      if (local_28 == (long *)0x0) {
        plVar6[2] = (long)flist;
        plVar6[1] = 0;
        plVar3 = plVar6;
        if (flist != (long *)0x0) {
          flist[1] = (long)plVar6;
        }
      }
      else {
        if (plVar6 <= local_28) {
          this = (runtime_error *)__cxa_allocate_exception(0x10);
          std::runtime_error::runtime_error
                    (this,"AGH!!!! What a world, what a world! This was never supposed to happen.\n"
                    );
          __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
        }
        plVar6[2] = local_28[2];
        plVar6[1] = (long)local_28;
        if (plVar6[2] != 0) {
          *(long **)(plVar6[2] + 8) = plVar6;
        }
        *(long **)(plVar6[1] + 0x10) = plVar6;
        plVar3 = flist;
      }
      flist = plVar3;
      lVar1 = plVar6[2];
      sVar5 = chunk_t_size();
      if (lVar1 == (long)plVar6 + *plVar6 + sVar5) {
        sVar5 = chunk_t_size();
        *plVar6 = sVar5 + *(long *)plVar6[2] + *plVar6;
        plVar6[2] = *(long *)(plVar6[2] + 0x10);
        if (plVar6[2] != 0) {
          *(long **)(plVar6[2] + 8) = plVar6;
        }
      }
      if (((plVar6[1] != 0) &&
          (lVar1 = *(long *)(plVar6[1] + 0x10), lVar2 = plVar6[1], sVar5 = chunk_t_size(),
          lVar1 == lVar2 + sVar5 + *(long *)plVar6[1])) && (*(long **)(plVar6[1] + 0x10) == plVar6))
      {
        sVar5 = chunk_t_size();
        *(long *)plVar6[1] = sVar5 + *plVar6 + *(long *)plVar6[1];
        *(long *)(plVar6[1] + 0x10) = plVar6[2];
        if (*(long *)(plVar6[1] + 0x10) != 0) {
          *(long *)(*(long *)(plVar6[1] + 0x10) + 8) = plVar6[1];
        }
      }
      std::mutex::unlock((mutex *)malloc_mutex);
    }
  }
  return;
}

Assistant:

inline void local_free(const GlobalPtr <T> &ptr) {
  if (bcl_finalized) {
    return;
  }
  BCL::malloc_mutex.lock();
  char *vptr = (char *) ptr.local();

  if (vptr == nullptr) {
    BCL::malloc_mutex.unlock();
    return;
  }

  chunk_t *my_chunk = (chunk_t *) (vptr - chunk_t_size());
  chunk_t *neighbor_chunk = flist;

  // Keep free list in order to
  // make compaction easy
  while (neighbor_chunk != NULL) {
    if (my_chunk > neighbor_chunk) {
      break;
    }
    neighbor_chunk = neighbor_chunk->next;
  }

  // I am the primordial chunk.
  if (neighbor_chunk == NULL) {
    my_chunk->next = flist;
    my_chunk->last = NULL;
    if (flist != NULL) {
      flist->last = my_chunk;
    }
    flist = my_chunk;
  } else {
    if (my_chunk > neighbor_chunk) {
      my_chunk->next = neighbor_chunk->next;
      my_chunk->last = neighbor_chunk;
      if (my_chunk->next != NULL) {
        my_chunk->next->last = my_chunk;
      }
      my_chunk->last->next = my_chunk;
    } else {
      throw std::runtime_error("AGH!!!! What a world, what a world! This was never supposed to happen.\n");
      // TODO: there's a bug here--the "primordial chunk" can be lost.
      my_chunk->next = neighbor_chunk;
      my_chunk->last = neighbor_chunk->last;
      my_chunk->next->last = my_chunk;
      if (my_chunk->last != NULL) {
        my_chunk->last->next = my_chunk;
      }
      if (flist == neighbor_chunk) {
        flist = my_chunk;
      }
    }
  }

  // Compact!

  // If chunk directly after is free, compact.
  if ((char *) my_chunk->next == ((char *) my_chunk) + chunk_t_size() + my_chunk->size) {
    my_chunk->size += chunk_t_size() + my_chunk->next->size;
    my_chunk->next = my_chunk->next->next;
    if (my_chunk->next != NULL) {
      my_chunk->next->last = my_chunk;
    }
  }

  // If chunk directly before is free, compact.
  if (my_chunk->last != NULL &&
    (char *) my_chunk->last->next == ((char *) my_chunk->last) + chunk_t_size() + my_chunk->last->size &&
    my_chunk->last->next == my_chunk) {
      my_chunk->last->size += chunk_t_size() + my_chunk->size;
      my_chunk->last->next = my_chunk->next;
      if (my_chunk->last->next != NULL) {
        my_chunk->last->next->last = my_chunk->last;
      }
  }
  BCL::malloc_mutex.unlock();
}